

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdbusmenubar.cpp
# Opt level: O0

void QDBusMenuBar::updateMenuItem(QDBusPlatformMenuItem *item,QPlatformMenu *menu)

{
  undefined1 uVar1;
  bool bVar2;
  QDBusPlatformMenu *this;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 in_RSI;
  QIcon *in_RDI;
  long in_FS_OFFSET;
  QDBusPlatformMenu *ourMenu;
  QDBusPlatformMenu *in_stack_ffffffffffffff88;
  QIcon *this_00;
  undefined1 local_28 [8];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this = qobject_cast<QDBusPlatformMenu_const*>((QObject *)0xaedd6a);
  this_00 = in_RDI;
  QDBusPlatformMenu::text(in_stack_ffffffffffffff88);
  (**(code **)&this_00->d[4].detach_no)(this_00,local_20);
  QString::~QString((QString *)0xaeddaa);
  QDBusPlatformMenu::icon(in_stack_ffffffffffffff88);
  (*(code *)in_RDI->d[5].engine)(in_RDI,local_28);
  QIcon::~QIcon(this_00);
  uVar1 = (**(code **)(*(long *)&this->super_QPlatformMenu + 0xa8))();
  (*(code *)in_RDI->d[8].engine)(in_RDI,uVar1,extraout_RDX,uVar1);
  bVar2 = QDBusPlatformMenu::isVisible((QDBusPlatformMenu *)this);
  (**(code **)&in_RDI->d[5].detach_no)(in_RDI,bVar2,extraout_RDX_00,bVar2);
  (**(code **)&in_RDI->d[5].ref)(in_RDI,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDBusMenuBar::updateMenuItem(QDBusPlatformMenuItem *item, QPlatformMenu *menu)
{
    const QDBusPlatformMenu *ourMenu = qobject_cast<const QDBusPlatformMenu *>(menu);
    item->setText(ourMenu->text());
    item->setIcon(ourMenu->icon());
    item->setEnabled(ourMenu->isEnabled());
    item->setVisible(ourMenu->isVisible());
    item->setMenu(menu);
}